

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,signed_char,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (char *idata,AggregateInputData *aggr_input_data,
               QuantileState<signed_char,_duckdb::QuantileStandardType> **states,ValidityMask *mask,
               idx_t count)

{
  QuantileState<signed_char,_duckdb::QuantileStandardType> **ppQVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *input;
  ulong uVar11;
  ulong uVar12;
  AggregateUnaryInput local_60;
  ulong local_48;
  ulong local_40;
  ValidityMask *local_38;
  
  local_60.input = aggr_input_data;
  local_60.input_mask = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    local_60.input_idx = 0;
    if (count != 0) {
      do {
        QuantileOperation::
        Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                  (states[local_60.input_idx],idata + local_60.input_idx,&local_60);
        local_60.input_idx = local_60.input_idx + 1;
      } while (local_60.input_idx < count);
    }
  }
  else {
    local_60.input_idx = 0;
    if (0x3f < count + 0x3f) {
      local_40 = count + 0x3f >> 6;
      uVar11 = 0;
      uVar10 = 0;
      uVar9 = 0;
      local_48 = count;
      local_38 = mask;
      do {
        puVar2 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar12 = uVar9 + 0x40;
          if (local_48 <= uVar9 + 0x40) {
            uVar12 = local_48;
          }
joined_r0x00df64e0:
          while (uVar8 = uVar11, uVar5 = uVar11, uVar6 = local_60.input_idx, uVar11 < uVar12) {
            QuantileOperation::
            Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                      (states[uVar11],idata + uVar11,&local_60);
            uVar11 = local_60.input_idx + 1;
            local_60.input_idx = uVar11;
          }
        }
        else {
          uVar3 = puVar2[uVar10];
          uVar12 = uVar9 + 0x40;
          if (local_48 <= uVar9 + 0x40) {
            uVar12 = local_48;
          }
          if (uVar3 == 0xffffffffffffffff) goto joined_r0x00df64e0;
          uVar8 = uVar12;
          uVar5 = uVar12;
          uVar6 = uVar12;
          uVar7 = uVar9;
          uVar4 = local_60.input_idx;
          if (uVar3 != 0) {
            while (local_60.input_idx = uVar7, uVar8 = local_60.input_idx, uVar5 = uVar11,
                  uVar6 = uVar4, local_60.input_idx < uVar12) {
              if ((uVar3 >> ((ulong)(uint)((int)local_60.input_idx - (int)uVar9) & 0x3f) & 1) != 0)
              {
                ppQVar1 = states + local_60.input_idx;
                input = idata + local_60.input_idx;
                local_60.input_idx = uVar4;
                QuantileOperation::
                Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                          (*ppQVar1,input,&local_60);
              }
              uVar11 = local_60.input_idx + 1;
              uVar4 = uVar11;
              uVar7 = uVar11;
            }
          }
        }
        local_60.input_idx = uVar6;
        uVar11 = uVar5;
        uVar10 = uVar10 + 1;
        uVar9 = uVar8;
      } while (uVar10 != local_40);
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}